

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datrie.c
# Opt level: O2

size_t dictionary_datrie_get_all_match_lengths
                 (dictionary_t t_dictionary,ucs4_t *word,size_t *match_length)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  sVar4 = 0;
  sVar3 = 0;
  uVar7 = 0;
  while( true ) {
    if (word[sVar4] == 0) {
      return sVar3;
    }
    lVar2 = *t_dictionary;
    iVar1 = *(int *)(lVar2 + uVar7 * 0xc);
    if (iVar1 == -1) {
      return sVar3;
    }
    uVar5 = iVar1 + word[sVar4];
    if ((int)uVar5 < 0) {
      return sVar3;
    }
    if (*(uint *)((long)t_dictionary + 8) <= uVar5) break;
    uVar6 = (ulong)uVar5;
    if (uVar7 != (long)*(int *)(lVar2 + 4 + uVar6 * 0xc)) {
      return sVar3;
    }
    sVar4 = sVar4 + 1;
    uVar7 = uVar6;
    if (*(int *)(lVar2 + uVar6 * 0xc + 8) != -1) {
      match_length[sVar3] = sVar4;
      sVar3 = sVar3 + 1;
    }
  }
  return sVar3;
}

Assistant:

size_t dictionary_datrie_get_all_match_lengths(dictionary_t t_dictionary, const ucs4_t * word,
		size_t * match_length)
{
	datrie_dictionary_desc * datrie_dictionary = (datrie_dictionary_desc *) t_dictionary;

	size_t rscnt = 0;

	size_t i, p;
	for (i = 0,p = 0; word[p] && datrie_dictionary->dat[i].base != DATRIE_UNUSED; p ++)
	{
		int k = encode_char(word[p]);
		int j = datrie_dictionary->dat[i].base + k;
		if (j < 0 || j >= datrie_dictionary->dat_item_count || datrie_dictionary->dat[j].parent != i)
			break;
		i = j;

		if (datrie_dictionary->dat[i].word != -1)
			match_length[rscnt ++] = p + 1;
	}

	return rscnt;
}